

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_rewriter.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::ExpressionRewriter::ApplyRules
          (ExpressionRewriter *this,LogicalOperator *op,
          vector<std::reference_wrapper<duckdb::Rule>,_true> *rules,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr,
          bool *changes_made,bool is_root)

{
  pointer prVar1;
  pointer pcVar2;
  int iVar3;
  pointer pEVar4;
  type pEVar5;
  pointer pEVar6;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var7;
  pointer prVar8;
  int iVar9;
  bool rule_made_change;
  string alias;
  vector<std::reference_wrapper<duckdb::Expression>,_true> bindings;
  char local_99;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_98;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_90;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_88;
  bool *local_80;
  uint local_74;
  _Any_data local_70;
  _Manager_type local_60;
  code *local_58;
  vector<std::reference_wrapper<duckdb::Rule>,_true> *local_50;
  void *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  prVar8 = (rules->
           super_vector<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
           ).
           super__Vector_base<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  prVar1 = (rules->
           super_vector<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
           ).
           super__Vector_base<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_88._M_head_impl = (Expression *)this;
  local_80 = changes_made;
  local_50 = rules;
  if (prVar8 != prVar1) {
    local_74 = (uint)is_root;
    do {
      local_48 = (void *)0x0;
      uStack_40 = 0;
      local_38 = 0;
      pEVar4 = unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
               ::operator->(&prVar8->_M_data->root);
      pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(expr);
      iVar3 = (*pEVar4->_vptr_ExpressionMatcher[2])(pEVar4,pEVar5,&local_48);
      iVar9 = 0;
      if ((char)iVar3 != '\0') {
        local_99 = '\0';
        pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(expr);
        local_70._M_unused._M_object = &local_60;
        pcVar2 = (pEVar6->super_BaseExpression).alias._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar2,
                   pcVar2 + (pEVar6->super_BaseExpression).alias._M_string_length);
        (*prVar8->_M_data->_vptr_Rule[2])(&local_98,prVar8->_M_data,op,&local_48,&local_99);
        if (local_98._M_head_impl == (Expression *)0x0) {
          iVar9 = 3;
          if (local_99 == '\x01') {
            *local_80 = true;
            ((local_88._M_head_impl)->super_BaseExpression)._vptr_BaseExpression =
                 (_func_int **)
                 (expr->
                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
                 _M_t.
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
            (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
            _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
            iVar9 = 1;
          }
        }
        else {
          *local_80 = true;
          _Var7._M_head_impl = local_98._M_head_impl;
          if (local_70._8_8_ != 0) {
            pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                     operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                 *)&local_98);
            ::std::__cxx11::string::operator=
                      ((string *)&(pEVar6->super_BaseExpression).alias,
                       (string *)local_70._M_pod_data);
            _Var7._M_head_impl = local_98._M_head_impl;
          }
          local_98._M_head_impl = (Expression *)0x0;
          local_90._M_head_impl = _Var7._M_head_impl;
          ApplyRules((ExpressionRewriter *)local_88._M_head_impl,op,local_50,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&local_90,local_80,false);
          if (local_90._M_head_impl != (Expression *)0x0) {
            (*((local_90._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
          }
          local_90._M_head_impl = (Expression *)0x0;
          iVar9 = 1;
          if (local_98._M_head_impl != (Expression *)0x0) {
            (*((local_98._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
          }
        }
        if ((_Manager_type *)local_70._M_unused._0_8_ != &local_60) {
          operator_delete(local_70._M_unused._M_object);
        }
      }
      if (local_48 != (void *)0x0) {
        operator_delete(local_48);
      }
      if ((iVar9 != 3) && (iVar9 != 0)) {
        return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
               (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
               local_88._M_head_impl;
      }
      prVar8 = prVar8 + 1;
    } while (prVar8 != prVar1);
  }
  pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (expr);
  local_70._8_8_ = 0;
  local_70._M_unused._M_object = operator_new(0x18);
  *(LogicalOperator **)local_70._M_unused._0_8_ = op;
  *(vector<std::reference_wrapper<duckdb::Rule>,_true> **)((long)local_70._M_unused._0_8_ + 8) =
       local_50;
  *(bool **)((long)local_70._M_unused._0_8_ + 0x10) = local_80;
  local_58 = ::std::
             _Function_handler<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/optimizer/expression_rewriter.cpp:41:47)>
             ::_M_invoke;
  local_60 = ::std::
             _Function_handler<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/optimizer/expression_rewriter.cpp:41:47)>
             ::_M_manager;
  ExpressionIterator::EnumerateChildren
            (pEVar5,(function<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&)>
                     *)&local_70);
  if (local_60 != (_Manager_type)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  *(Expression **)local_88._M_head_impl =
       (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
         local_88._M_head_impl;
}

Assistant:

unique_ptr<Expression> ExpressionRewriter::ApplyRules(LogicalOperator &op, const vector<reference<Rule>> &rules,
                                                      unique_ptr<Expression> expr, bool &changes_made, bool is_root) {
	for (auto &rule : rules) {
		vector<reference<Expression>> bindings;
		if (rule.get().root->Match(*expr, bindings)) {
			// the rule matches! try to apply it
			bool rule_made_change = false;
			auto alias = expr->alias;
			auto result = rule.get().Apply(op, bindings, rule_made_change, is_root);
			if (result) {
				changes_made = true;
				// the base node changed: the rule applied changes
				// rerun on the new node
				if (!alias.empty()) {
					result->alias = std::move(alias);
				}
				return ExpressionRewriter::ApplyRules(op, rules, std::move(result), changes_made);
			} else if (rule_made_change) {
				changes_made = true;
				// the base node didn't change, but changes were made, rerun
				return expr;
			}
			// else nothing changed, continue to the next rule
			continue;
		}
	}
	// no changes could be made to this node
	// recursively run on the children of this node
	ExpressionIterator::EnumerateChildren(*expr, [&](unique_ptr<Expression> &child) {
		child = ExpressionRewriter::ApplyRules(op, rules, std::move(child), changes_made);
	});
	return expr;
}